

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapOutput.c
# Opt level: O3

Amap_Out_t * Amap_OutputStructAlloc(Aig_MmFlex_t *pMem,Amap_Gat_t *pGate)

{
  char *__s;
  Amap_Out_t *pAVar1;
  size_t sVar2;
  char *__dest;
  uint uVar3;
  
  if (pGate == (Amap_Gat_t *)0x0) {
    uVar3 = 1;
  }
  else {
    uVar3 = (uint)(byte)pGate->field_0x3b;
  }
  pAVar1 = (Amap_Out_t *)Aig_MmFlexEntryFetch(pMem,uVar3 * 4 + 0x10);
  pAVar1->pName = (char *)0x0;
  pAVar1->Type = 0;
  pAVar1->nFans = 0;
  *(undefined4 *)&pAVar1->field_0xc = 0;
  memset(&pAVar1->field_0xc,0xff,(ulong)(uVar3 * 4));
  if ((pGate == (Amap_Gat_t *)0x0) || (__s = pGate->pName, __s == (char *)0x0)) {
    __dest = (char *)0x0;
  }
  else {
    sVar2 = strlen(__s);
    __dest = Aig_MmFlexEntryFetch(pMem,(int)sVar2 + 1);
    strcpy(__dest,__s);
  }
  pAVar1->pName = __dest;
  pAVar1->nFans = (short)uVar3;
  return pAVar1;
}

Assistant:

Amap_Out_t * Amap_OutputStructAlloc( Aig_MmFlex_t * pMem, Amap_Gat_t * pGate )
{
    Amap_Out_t * pRes;
    int nFans = pGate? pGate->nPins : 1;
    pRes = (Amap_Out_t *)Aig_MmFlexEntryFetch( pMem, sizeof(Amap_Out_t)+sizeof(int)*nFans );
    memset( pRes, 0, sizeof(Amap_Out_t) );
    memset( pRes->pFans, 0xff, sizeof(int)*nFans );
    pRes->pName = pGate? Amap_OuputStrsav( pMem, pGate->pName ) : NULL;
    pRes->nFans = nFans;
    return pRes;
}